

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

dataflags NodeContext_FindDataType(tchar_t *Type,tchar_t *Format)

{
  bool_t bVar1;
  ulong local_30;
  dataflags j;
  dataflags i;
  tchar_t *Format_local;
  tchar_t *Type_local;
  
  j = 0;
  while( true ) {
    if (0x29 < j) {
      return 0;
    }
    if ((ParamName[j] != (tchar_t *)0x0) && (bVar1 = tcsisame_ascii(Type,ParamName[j]), bVar1 != 0))
    break;
    j = j + 1;
  }
  if ((Format != (tchar_t *)0x0) && (*Format != '\0')) {
    for (local_30 = 1; (local_30 & 0x1f) != 0; local_30 = local_30 + 1) {
      if ((ParamFormat[local_30] != (tchar_t *)0x0) &&
         (bVar1 = tcsisame_ascii(Format,ParamFormat[local_30]), bVar1 != 0)) {
        return local_30 << 0x18 | j;
      }
    }
  }
  return j;
}

Assistant:

dataflags NodeContext_FindDataType(const tchar_t* Type, const tchar_t* Format)
{
    dataflags i;
    for (i=0;i<MAX_PARAMTYPE;++i)
        if (ParamName[i] && tcsisame_ascii(Type,ParamName[i]))
        {
            if (Format && Format[0])
            {
                dataflags j;
                for (j=1;(j<<TUNIT_SHIFT) & TUNIT_MASK;++j)
                    if (ParamFormat[j] && tcsisame_ascii(Format,ParamFormat[j]))
                    {
                        i |= j<<TUNIT_SHIFT;
                        break;
                    }
            }
            return i;
        }
    return 0;
}